

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O3

bool __thiscall
Js::ProbeContainer::AdvanceToNextUserStatement
          (ProbeContainer *this,FunctionBody *functionBody,ByteCodeReader *reader)

{
  bool bVar1;
  uint uVar2;
  undefined8 in_RAX;
  int local_24 [2];
  int nextStatementOffset;
  
  local_24[0] = (int)((ulong)in_RAX >> 0x20);
  uVar2 = ByteCodeReader::GetCurrentOffset(reader);
  bVar1 = GetNextUserStatementOffsetForAdvance(this,functionBody,reader,uVar2 - 1,local_24);
  if (bVar1) {
    ByteCodeReader::SetCurrentOffset(reader,local_24[0]);
  }
  return bVar1;
}

Assistant:

bool ProbeContainer::AdvanceToNextUserStatement(Js::FunctionBody* functionBody, ByteCodeReader* reader)
    {
        // Move back a byte to make sure we are within the bounds of
        // our current statement (See DispatchExceptionBreakpoint)
        int currentOffset = reader->GetCurrentOffset() - 1;
        int nextStatementOffset;

        if (this->GetNextUserStatementOffsetForAdvance(functionBody, reader, currentOffset, &nextStatementOffset))
        {
            reader->SetCurrentOffset(nextStatementOffset);
            return true;
        }
        return false;
    }